

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

trie_node * trie_remove(trie_node *root,lrtr_ip_addr *prefix,uint8_t mask_len,uint lvl)

{
  long lVar1;
  void *pvVar2;
  _Bool _Var3;
  long in_FS_OFFSET;
  void *tmp;
  uint lvl_local;
  uint8_t mask_len_local;
  lrtr_ip_addr *prefix_local;
  trie_node *root_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3 = prefix_is_same(root,prefix,mask_len);
  if (_Var3) {
    _Var3 = trie_is_leaf(root);
    if (_Var3) {
      deref_node(root);
      root_local = root;
    }
    else if ((root->lchild == (trie_node *)0x0) ||
            ((root->rchild != (trie_node *)0x0 && (root->rchild->len <= root->lchild->len)))) {
      pvVar2 = root->data;
      replace_node_data(root,root->rchild);
      root->rchild->data = pvVar2;
      root_local = trie_remove(root->rchild,&root->rchild->prefix,root->rchild->len,lvl + 1);
    }
    else {
      pvVar2 = root->data;
      replace_node_data(root,root->lchild);
      root->lchild->data = pvVar2;
      root_local = trie_remove(root->lchild,&root->lchild->prefix,root->lchild->len,lvl + 1);
    }
  }
  else {
    _Var3 = is_left_child(prefix,lvl);
    if (_Var3) {
      if (root->lchild == (trie_node *)0x0) {
        root_local = (trie_node *)0x0;
      }
      else {
        root_local = trie_remove(root->lchild,prefix,mask_len,lvl + 1);
      }
    }
    else if (root->rchild == (trie_node *)0x0) {
      root_local = (trie_node *)0x0;
    }
    else {
      root_local = trie_remove(root->rchild,prefix,mask_len,lvl + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return root_local;
  }
  __stack_chk_fail();
}

Assistant:

struct trie_node *trie_remove(struct trie_node *root, const struct lrtr_ip_addr *prefix, const uint8_t mask_len,
			      const unsigned int lvl)
{
	/* If the node has no children we can simply remove it
	 * If the node has children, we swap the node with the child that
	 * has the smaller prefix length and drop the child.
	 */
	if (prefix_is_same(root, prefix, mask_len)) {
		void *tmp;

		if (trie_is_leaf(root)) {
			deref_node(root);
			return root;
		}

		/* swap with the left child and drop the child */
		if (root->lchild && (!root->rchild || root->lchild->len < root->rchild->len)) {
			tmp = root->data;
			replace_node_data(root, root->lchild);
			root->lchild->data = tmp;

			return trie_remove(root->lchild, &root->lchild->prefix, root->lchild->len, lvl + 1);
		}

		/* swap with the right child and drop the child */
		tmp = root->data;
		replace_node_data(root, root->rchild);
		root->rchild->data = tmp;

		return trie_remove(root->rchild, &root->rchild->prefix, root->rchild->len, lvl + 1);
	}

	if (is_left_child(prefix, lvl)) {
		if (!root->lchild)
			return NULL;
		return trie_remove(root->lchild, prefix, mask_len, lvl + 1);
	}

	if (!root->rchild)
		return NULL;
	return trie_remove(root->rchild, prefix, mask_len, lvl + 1);
}